

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
__thiscall
testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
          (testing *this,
          vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *value)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_> RVar4;
  
  pCVar1 = (value->
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (value->
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar3 = (value->
           super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __p = (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
        operator_new(0x18);
  (__p->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl
  .super__Vector_impl_data._M_start = pCVar1;
  (__p->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl
  .super__Vector_impl_data._M_finish = pCVar2;
  (__p->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = pCVar3;
  *(vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> **)this = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),__p);
  RVar4.value_.
  super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar4.value_.
  super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
          )RVar4.value_.
           super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}